

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianPreInt
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Scalar *pSVar5;
  Scalar *pSVar6;
  uint v;
  long lVar7;
  long startCol;
  long lVar8;
  uint i;
  long lVar9;
  undefined1 auVar10 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar11 [16];
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow1;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow0;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow2;
  Matrix3xN temp;
  MatrixNxN K_K13Compact;
  Matrix3xN e_bar;
  Matrix3xN e_bar_dot;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  Matrix<double,_9,_256,_0,_9,_256> *local_9eb8 [6];
  double local_9e88;
  Matrix<double,_1,_16,_1,_1,_16> local_9e80;
  Matrix<double,_1,_16,_1,_1,_16> local_9e00;
  Matrix<double,_1,_16,_1,_1,_16> local_9d80;
  PlainObjectBase<Eigen::Matrix<double,3,16,1,3,16>> local_9d00 [128];
  undefined1 local_9c80 [128];
  undefined1 local_9c00 [128];
  undefined1 local_9b80 [16];
  scalar_constant_op<double> sStack_9b70;
  variable_if_dynamic<long,__1> vStack_9b68;
  variable_if_dynamic<long,__1> vStack_9b60;
  double dStack_9b58;
  Matrix<double,_3,_16,_1,_3,_16> local_9380;
  StorageBaseType local_9200 [384];
  Matrix<double,_9,_256,_0,_9,_256> local_9080;
  Matrix<double,_9,_256,_0,_9,_256> local_4880;
  
  CalcCoordMatrix(this,(Matrix3xN *)&local_9380);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_9200);
  auVar3._8_8_ = in_XMM0_Qb;
  auVar3._0_8_ = Kfactor;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = Rfactor;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->m_Alpha;
  auVar10 = vfmadd132sd_fma(auVar11,auVar3,auVar10);
  local_9e00.super_PlainObjectBase<Eigen::Matrix<double,_1,_16,_1,_1,_16>_>.m_storage.m_data.array
  [0] = auVar10._0_8_;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>
                    *)&local_9080,(double *)&local_9e00,(StorageBaseType *)&local_9380);
  local_9e80.super_PlainObjectBase<Eigen::Matrix<double,_1,_16,_1,_1,_16>_>.m_storage.m_data.array
  [0] = Kfactor * this->m_Alpha;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>
                    *)local_9b80,(double *)&local_9e80,local_9200);
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [3] = local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data
        .array[2];
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [4] = local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data
        .array[3];
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [8] = sStack_9b70.m_other;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [9] = (double)vStack_9b68.m_value;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,16,1,3,16>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,16,1,3,16>const>const,Eigen::Matrix<double,3,16,1,3,16>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,16,1,3,16>const>const,Eigen::Matrix<double,3,16,1,3,16>const>const>>
            (local_9d00,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>,_const_Eigen::Matrix<double,_3,_16,_1,_3,_16>_>_>_>
              *)&local_4880);
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [3] = 0.0;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [4] = 0.0;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [5] = 7.90505033345994e-323;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [0] = (double)local_9d00;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,16,1,1,16>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,16,1,3,16>,1,16,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,16,1,1,16>> *)&local_9e00,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_1,_16,_false>_> *)
             &local_4880);
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [0] = (double)local_9c80;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [4] = 0.0;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [5] = 7.90505033345994e-323;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,16,1,1,16>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,16,1,3,16>,1,16,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,16,1,1,16>> *)&local_9e80,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_1,_16,_false>_> *)
             &local_4880);
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [0] = (double)local_9c00;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [3] = 9.88131291682493e-324;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [4] = 0.0;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [5] = 7.90505033345994e-323;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,16,1,1,16>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<double,3,16,1,3,16>,1,16,false>>
            ((PlainObjectBase<Eigen::Matrix<double,1,16,1,1,16>> *)&local_9d80,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_1,_16,_false>_> *)
             &local_4880);
  lVar9 = 0;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false> *)local_9b80,&local_9380,
               0,lVar7);
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[6] = (double)&local_9e00;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[4] = (double)vStack_9b60.m_value;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[5] = dStack_9b58;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[0] = (double)local_9b80._0_8_;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[1] = (double)local_9b80._8_8_;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[2] = sStack_9b70.m_other;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[3] = (double)vStack_9b68.m_value;
    Eigen::Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false> *)local_9eb8,
               &local_4880,0,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,256,0,9,256>,3,16,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,16,1,3,16>,3,1,false>,Eigen::Matrix<double,1,16,1,1,16>,0>>
              ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false> *)local_9eb8,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false>,_Eigen::Matrix<double,_1,_16,_1,_1,_16>,_0>
                *)&local_9080);
    Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false> *)local_9b80,&local_9380,
               0,lVar7);
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[6] = (double)&local_9e80;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[4] = (double)vStack_9b60.m_value;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[5] = dStack_9b58;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[0] = (double)local_9b80._0_8_;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[1] = (double)local_9b80._8_8_;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[2] = sStack_9b70.m_other;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[3] = (double)vStack_9b68.m_value;
    Eigen::Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false> *)local_9eb8,
               &local_4880,3,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,256,0,9,256>,3,16,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,16,1,3,16>,3,1,false>,Eigen::Matrix<double,1,16,1,1,16>,0>>
              ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false> *)local_9eb8,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false>,_Eigen::Matrix<double,_1,_16,_1,_1,_16>,_0>
                *)&local_9080);
    Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false> *)local_9b80,&local_9380,
               0,lVar7);
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[6] = (double)&local_9d80;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[4] = (double)vStack_9b60.m_value;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[5] = dStack_9b58;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[0] = (double)local_9b80._0_8_;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[1] = (double)local_9b80._8_8_;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[2] = sStack_9b70.m_other;
    local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
    array[3] = (double)vStack_9b68.m_value;
    Eigen::Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false>::Block
              ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false> *)local_9eb8,
               &local_4880,6,lVar9);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,9,256,0,9,256>,3,16,false>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,16,1,3,16>,3,1,false>,Eigen::Matrix<double,1,16,1,1,16>,0>>
              ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_16,_false> *)local_9eb8,
               (Product<Eigen::Block<Eigen::Matrix<double,_3,_16,_1,_3,_16>,_3,_1,_false>,_Eigen::Matrix<double,_1,_16,_1,_1,_16>,_0>
                *)&local_9080);
    lVar9 = lVar9 + 0x10;
  }
  local_9eb8[0] = &local_4880;
  Eigen::
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_256,_0,_9,_256>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
  ::Product((Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_256,_0,_9,_256>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
             *)local_9b80,(Lhs *)local_9eb8,&this->m_O2);
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,256,0,9,256>>::
  PlainObjectBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,256,0,9,256>const>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,9,256,0,9,256>> *)&local_9080,
             (DenseBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_256,_0,_9,_256>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)local_9b80);
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    lVar8 = lVar7 * 3;
    startCol = lVar7;
    for (lVar9 = 2; lVar9 != 0x32; lVar9 = lVar9 + 3) {
      Eigen::Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false> *)local_9b80,
                 &local_9080,0,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)local_9eb8,H,lVar8,lVar9 + -2);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,9,256,0,9,256>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)local_9eb8,
                 (Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false> *)local_9b80);
      Eigen::Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false> *)local_9b80,
                 &local_9080,3,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)local_9eb8,H,lVar8,lVar9 + -1);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,9,256,0,9,256>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)local_9eb8,
                 (Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false> *)local_9b80);
      Eigen::Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false>::Block
                ((Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false> *)local_9b80,
                 &local_9080,6,startCol);
      Eigen::
      Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_3,_1,_false>
      ::Block((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
               *)local_9eb8,H,lVar8,lVar9);
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,3,1,false>,Eigen::Block<Eigen::Matrix<double,9,256,0,9,256>,3,1,false>>
                ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_3,_1,_false>
                  *)local_9eb8,
                 (Block<Eigen::Matrix<double,_9,_256,_0,_9,_256>,_3,_1,_false> *)local_9b80);
      startCol = startCol + 0x10;
    }
  }
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = Kfactor;
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar10 = vxorpd_avx512vl(auVar4,auVar2);
  local_9e88 = (double)vmovlpd_avx(auVar10);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    *)local_9eb8,&local_9e88,(StorageBaseType *)&this->m_K13Compact);
  Eigen::PlainObjectBase<Eigen::Matrix<double,16,16,1,16,16>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,16,16,1,16,16>> *)local_9b80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)local_9eb8);
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
    lVar9 = 0;
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>,_1> *)local_9b80
                          ,lVar7,lVar8);
      dVar1 = *pSVar5;
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,lVar7 * 3,lVar9);
      *pSVar6 = dVar1 + *pSVar6;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>,_1> *)local_9b80
                          ,lVar7,lVar8);
      dVar1 = *pSVar5;
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,lVar7 * 3 + 1,lVar9 + 1);
      *pSVar6 = dVar1 + *pSVar6;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_16,_16,_1,_16,_16>,_1> *)local_9b80
                          ,lVar7,lVar8);
      dVar1 = *pSVar5;
      pSVar6 = Eigen::
               DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
               ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                             *)H,lVar7 * 3 + 2,lVar9 + 2);
      lVar9 = lVar9 + 3;
      *pSVar6 = dVar1 + *pSVar6;
    }
  }
  return;
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianPreInt(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  This makes this method well suited for applications
    // with many discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature
    // points used throughout the entire element.  Since computationally expensive quantities are required for both the
    // generalized internal force vector and its Jacobian, these values were cached for reuse during this Jacobian
    // calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            H(3 * i, 3 * j) += K_K13Compact(i, j);
            H(3 * i + 1, 3 * j + 1) += K_K13Compact(i, j);
            H(3 * i + 2, 3 * j + 2) += K_K13Compact(i, j);
        }
    }
}